

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::TermPass0
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this,int depth)

{
  EncodedChar *pEVar1;
  EncodedChar *location;
  code *pcVar2;
  bool bVar3;
  EncodedChar EVar4;
  Char CVar5;
  CharCount CVar6;
  CharCount CVar7;
  undefined4 *puVar8;
  HRESULT error;
  uint lineNumber;
  
  ThreadContext::ProbeStackNoDispose
            (this->scriptContext->threadContext,0x6000,this->scriptContext,(PVOID)0x0);
  pEVar1 = this->tempLocationOfSurrogatePair;
  EVar4 = ECLookahead(this,0);
  switch(EVar4) {
  case L'$':
switchD_00d24213_caseD_5e:
    ECConsume(this,1);
    return;
  case L'%':
  case L'&':
  case L'\'':
  case L',':
  case L'-':
switchD_00d241ed_caseD_25:
    location = this->next;
    CVar5 = NextChar(this);
    if (((this->scriptContext->config).threadConfig)->m_ES6Unicode == true) {
      TrackIfSurrogatePair
                (this,(uint)(ushort)CVar5,location,
                 (uint32)((ulong)((long)this->next - (long)location) >> 1));
    }
    if (CVar5 == L'/') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x4e7,"(!IsLiteral || c != \'/\')","!IsLiteral || c != \'/\'");
      if (!bVar3) goto LAB_00d245dc;
      *puVar8 = 0;
    }
    break;
  case L'(':
    this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
    this->codePointAtTempLocation = 0;
    ECConsume(this,1);
    EVar4 = ECLookahead(this,0);
    if (EVar4 == L'?') {
      if (this->inputLim < this->next + 2) {
        Fail(this,-0x7ff5ec67);
      }
      EVar4 = ECLookahead(this,1);
      if ((0x3d < (ushort)EVar4) ||
         ((0x2400000200000000U >> ((ulong)(ushort)EVar4 & 0x3f) & 1) == 0)) goto LAB_00d2455f;
      ECConsume(this,2);
    }
    else {
LAB_00d2455f:
      this->numGroups = this->numGroups + 1;
    }
    DisjunctionPass0(this,depth + 1);
    ECMust(this,L')',-0x7ff5ec64);
    goto LAB_00d243fa;
  case L')':
switchD_00d241ed_caseD_29:
    error = -0x7ff5ec67;
    goto LAB_00d24281;
  case L'*':
  case L'+':
switchD_00d241ed_caseD_2a:
    bVar3 = AtQuantifier(this);
    if (!bVar3) goto switchD_00d241ed_caseD_2e;
    error = -0x7ff5ec66;
LAB_00d24281:
    Fail(this,error);
    break;
  case L'.':
switchD_00d241ed_caseD_2e:
    ECConsume(this,1);
    break;
  default:
    switch(EVar4) {
    case L'[':
      ECConsume(this,1);
      this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
      this->codePointAtTempLocation = 0;
      this->tempLocationOfRange = this->next;
      CharacterClassPass0(this);
      this->tempLocationOfRange = (EncodedChar *)0x0;
      ECMust(this,L']',-0x7ff5ec65);
      break;
    case L'\\':
      ECConsume(this,1);
      bVar3 = AtomEscapePass0(this);
      if (bVar3) {
        return;
      }
      break;
    case L']':
switchD_00d24213_caseD_5d:
      NextChar(this);
      break;
    case L'^':
      goto switchD_00d24213_caseD_5e;
    default:
      if (EVar4 == L'\0') {
        if (this->inputLim <= this->next) {
          Fail(this,-0x7ff5ec67);
        }
      }
      else {
        if ((EVar4 == L'?') || (EVar4 == L'{')) goto switchD_00d241ed_caseD_2a;
        if (EVar4 == L'|') goto switchD_00d241ed_caseD_29;
        if (EVar4 == L'}') goto switchD_00d24213_caseD_5d;
      }
      goto switchD_00d241ed_caseD_25;
    }
  }
  if ((pEVar1 != (EncodedChar *)0x0) && (this->tempLocationOfSurrogatePair != (EncodedChar *)0x0)) {
    this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
    this->codePointAtTempLocation = 0;
  }
LAB_00d243fa:
  bVar3 = AtQuantifier(this);
  if (bVar3) {
    EVar4 = ECLookahead(this,0);
    if ((ushort)EVar4 - 0x2a < 2) goto LAB_00d24544;
    if (EVar4 == L'{') {
      ECConsume(this,1);
      CVar6 = RepeatCount(this);
      EVar4 = ECLookahead(this,0);
      if (EVar4 == L'}') goto LAB_00d24544;
      if (EVar4 == L',') {
        ECConsume(this,1);
        EVar4 = ECLookahead(this,0);
        if (EVar4 == L'}') {
LAB_00d24544:
          ECConsume(this,1);
          OptNonGreedy(this);
          return;
        }
        CVar7 = RepeatCount(this);
        if (CVar7 < CVar6) {
          Fail(this,-0x7ff5ec67);
        }
        EVar4 = ECLookahead(this,0);
        if (EVar4 == L'}') goto LAB_00d24544;
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x50e,"(ECLookahead() == \'}\')","ECLookahead() == \'}\'");
        if (bVar3) {
          *puVar8 = 0;
          goto LAB_00d24544;
        }
        goto LAB_00d245dc;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      lineNumber = 0x518;
    }
    else {
      if (EVar4 == L'?') goto LAB_00d24544;
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      lineNumber = 0x51e;
    }
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,lineNumber,"(false)","false");
    if (!bVar3) {
LAB_00d245dc:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
  }
  return;
}

Assistant:

void Parser<P, IsLiteral>::TermPass0(int depth)
    {
        PROBE_STACK_NO_DISPOSE(scriptContext, Js::Constants::MinStackRegex);
        // Either we have a location at the start, or the end, never both. As in between it should have been cleared if surrogate pair
        // Or must be cleared if we didn't perform the check
        bool clearLocationIfPresent = this->tempLocationOfSurrogatePair != nullptr;

        switch (ECLookahead())
        {
        case '^':
        case '$':
            ECConsume();
            return;
        case '\\':
            ECConsume();
            if (AtomEscapePass0())
                return;
            break;
        case '(':
            // Can't combine into a single codeunit because of group present
            this->tempLocationOfSurrogatePair = nullptr;
            this->codePointAtTempLocation = 0;
            clearLocationIfPresent = false;
            ECConsume();
            switch (ECLookahead())
            {
            case '?':
                if (!ECCanConsume(2))
                    Fail(JSERR_RegExpSyntax);
                switch (ECLookahead(1))
                {
                case '=':
                case '!':
                case ':':
                    ECConsume(2);
                    break;
                default:
                    numGroups++;
                    break;
                }
                break;
            default:
                numGroups++;
                break;
            }
            DisjunctionPass0(depth + 1);
            ECMust(')', JSERR_RegExpNoParen);
            break;
        case '.':
            ECConsume();
            break;
        case '[':
            ECConsume();
            this->tempLocationOfSurrogatePair = nullptr;
            this->codePointAtTempLocation = 0;
            this->tempLocationOfRange = next;
            CharacterClassPass0();
            this->tempLocationOfRange = nullptr;
            ECMust(']', JSERR_RegExpNoBracket);
            break;
        case ')':
        case '|':
            Fail(JSERR_RegExpSyntax);
            break;
        case ']':
        case '}':
            NextChar();
            break;
        case '*':
        case '+':
        case '?':
        case '{':
            if (AtQuantifier())
                Fail(JSERR_RegExpBadQuant);
            else
                ECConsume();
            break;
        case 0:
            if (IsEOF())
                // Terminating 0
                Fail(JSERR_RegExpSyntax);
            // else fall-through for embedded 0
        default:
            {
                const EncodedChar* current = next;
                Char c = NextChar();
                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    TrackIfSurrogatePair(c, current, (uint32)(next - current));
                }
                // Closing '/' in literals should be caught explicitly
                Assert(!IsLiteral || c != '/');
            }
            break;
        }

        if (clearLocationIfPresent && this->tempLocationOfSurrogatePair != nullptr)
        {
            this->tempLocationOfSurrogatePair = nullptr;
            this->codePointAtTempLocation = 0;
        }

        if (AtQuantifier())
        {
            switch (ECLookahead())
            {
            case '*':
            case '+':
            case '?':
                ECConsume();
                OptNonGreedy();
                break;
            case '{':
                {
                    ECConsume();
                    CharCount lower = RepeatCount();
                    switch (ECLookahead())
                    {
                    case ',':
                        ECConsume();
                        if (ECLookahead() == '}')
                        {
                            ECConsume();
                            OptNonGreedy();
                        }
                        else
                        {
                            CharCount upper = RepeatCount();
                            if (upper < lower)
                                Fail(JSERR_RegExpSyntax);
                            Assert(ECLookahead() == '}');
                            ECConsume();
                            OptNonGreedy();
                        }
                        break;
                    case '}':
                        ECConsume();
                        OptNonGreedy();
                        break;
                    default:
                        Assert(false);
                        break;
                    }
                    break;
                }
            default:
                Assert(false);
                break;
            }
        }
    }